

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O1

int armoroff(obj *otmp)

{
  char cVar1;
  int iVar2;
  
  cVar1 = objects[otmp->otyp].oc_delay;
  iVar2 = cursed(otmp);
  if (iVar2 != 0) {
    return iVar2;
  }
  if (cVar1 != '\0') {
    nomul(-(int)cVar1,"disrobing");
    off_msg_str(otmp,'\x01' < cVar1,'\x01');
    nomovemsg = off_msg_str::buf;
    if (otmp->oclass == '\x03') {
      if (objects[otmp->otyp].oc_subtyp == '\x02') {
        afternmv = Helmet_off;
        takeoff_mask = 0;
        taking_off = 0;
        return 0;
      }
      if (objects[otmp->otyp].oc_subtyp == '\x03') {
        afternmv = Gloves_off;
        takeoff_mask = 0;
        taking_off = 0;
        return 0;
      }
      if (objects[otmp->otyp].oc_subtyp == '\x04') {
        afternmv = Boots_off;
        takeoff_mask = 0;
        taking_off = 0;
        return 0;
      }
    }
    afternmv = Armor_off;
    takeoff_mask = 0;
    taking_off = 0;
    return 0;
  }
  if (otmp->oclass == '\x03') {
    if (objects[otmp->otyp].oc_subtyp == '\x05') {
      Cloak_off();
      goto LAB_00186fd5;
    }
    if (objects[otmp->otyp].oc_subtyp == '\x01') {
      Shield_off();
      goto LAB_00186fd5;
    }
    if (objects[otmp->otyp].oc_subtyp == '\x06') {
      Shirt_off();
      goto LAB_00186fd5;
    }
  }
  setworn((obj *)0x0,(ulong)(otmp->owornmask & 0x7f));
LAB_00186fd5:
  off_msg(otmp,'\x01');
  taking_off = 0;
  takeoff_mask = 0;
  return 0;
}

Assistant:

int armoroff(struct obj *otmp)
{
	int delay = -objects[otmp->otyp].oc_delay;

	if (cursed(otmp)) return 0;
	if (delay) {
		nomul(delay, "disrobing");
		nomovemsg = off_msg_str(otmp, -delay > 1, TRUE);
		if (is_helmet(otmp))
			afternmv = Helmet_off;
		else if (is_gloves(otmp))
			afternmv = Gloves_off;
		else if (is_boots(otmp))
			afternmv = Boots_off;
		else
			afternmv = Armor_off;
	} else {
		if (is_cloak(otmp))
			Cloak_off();
		else if (is_shield(otmp))
			Shield_off();
		else if (is_shirt(otmp))
			Shirt_off();
		else setworn(NULL, otmp->owornmask & W_ARMOR);
		off_msg(otmp, TRUE);
	}
	takeoff_mask = taking_off = 0L;
	return 1;
}